

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryBox.h
# Opt level: O0

void __thiscall adios2::kvcache::QueryBox::QueryBox(QueryBox *this,size_t dimCount)

{
  size_t *psVar1;
  DimsArray *in_RSI;
  CoreDims *in_RDI;
  size_t i;
  size_t in_stack_ffffffffffffffe8;
  DimsArray *index;
  
  helper::DimsArray::DimsArray(in_RSI,in_stack_ffffffffffffffe8);
  helper::DimsArray::DimsArray(in_RSI,in_stack_ffffffffffffffe8);
  for (index = (DimsArray *)0x0; index < in_RSI;
      index = (DimsArray *)((long)&(index->super_CoreDims).DimCount + 1)) {
    psVar1 = helper::CoreDims::operator[](in_RDI,(size_t)index);
    *psVar1 = 0;
    psVar1 = helper::CoreDims::operator[](in_RDI + 0x11,(size_t)index);
    *psVar1 = 0;
  }
  return;
}

Assistant:

explicit QueryBox(size_t dimCount) : Start(dimCount), Count(dimCount)
    {
        for (size_t i = 0; i < dimCount; ++i)
        {
            Start[i] = 0;
            Count[i] = 0;
        }
    }